

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char *s,basic_format_specs<char> *specs,locale_ref param_4)

{
  basic_format_specs<char> *pbVar1;
  locale_ref out_00;
  bool bVar2;
  uintptr_t value;
  locale_ref in_R9;
  basic_string_view<char> s_00;
  locale_ref local_68;
  appender local_60;
  char *local_58;
  detail *local_50;
  error_handler local_41;
  basic_format_specs<char> *local_40;
  basic_format_specs<char> *specs_local;
  char *s_local;
  locale_ref param_3_local;
  appender out_local;
  
  local_40 = specs;
  specs_local = (basic_format_specs<char> *)s;
  s_local = (char *)param_4.locale_;
  param_3_local.locale_ =
       (void *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  bVar2 = check_cstring_type_spec<fmt::v8::detail::error_handler>(specs->type,&local_41);
  out_00.locale_ = param_3_local.locale_;
  if (bVar2) {
    local_50 = (detail *)param_3_local.locale_;
    local_60.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v8::detail::buffer<char>_>)specs_local;
    local_58 = (char *)std::char_traits<char>::length((char_type *)specs_local);
    pbVar1 = local_40;
    locale_ref::locale_ref(&local_68);
    s_00.size_ = (size_t)pbVar1;
    s_00.data_ = local_58;
    out_local = write<char,fmt::v8::appender>
                          (local_50,local_60,s_00,(basic_format_specs<char> *)local_68.locale_,in_R9
                          );
  }
  else {
    value = to_uintptr(specs_local);
    out_local = write_ptr<char,fmt::v8::appender,unsigned_long>
                          ((appender)out_00.locale_,value,local_40);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, to_uintptr(s), &specs);
}